

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_examine_header(char *filename)

{
  uint uVar1;
  REF_STATUS RVar2;
  FILE *__stream;
  size_t sVar3;
  __off_t _Var4;
  __off_t _Var5;
  __off_t _Var6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  undefined8 uVar11;
  int i4;
  long i8;
  REF_FILEPOS next_position;
  int keyword_code;
  uint local_4c;
  undefined8 local_48;
  __off_t local_40;
  uint local_34;
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x6f1,
           "ref_import_examine_header","unable to open file");
    return 2;
  }
  puts(" -- 32bit ugrid header");
  rewind(__stream);
  uVar8 = 0;
  do {
    sVar3 = fread(&local_4c,4,1,__stream);
    if (sVar3 != 1) {
      pcVar10 = "int";
      uVar7 = 0x6f8;
      goto LAB_0020042d;
    }
    printf(" %d: %d (%d swapped) ints\n",(ulong)uVar8,(ulong)local_4c,
           (ulong)(local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 | (local_4c & 0xff00) << 8 |
                  local_4c << 0x18));
    uVar8 = uVar8 + 1;
  } while (uVar8 != 8);
  puts(" -- 64bit ugrid header");
  rewind(__stream);
  iVar9 = 3;
  do {
    sVar3 = fread(&local_4c,4,1,__stream);
    if (sVar3 != 1) {
      pcVar10 = "int";
      uVar7 = 0x703;
      goto LAB_0020042d;
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  uVar8 = 3;
  do {
    sVar3 = fread(&local_48,8,1,__stream);
    if (sVar3 != 1) {
      pcVar10 = "long";
      uVar7 = 0x706;
LAB_0020042d:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar7,"ref_import_examine_header",pcVar10);
      return 1;
    }
    uVar1 = (uint)local_48;
    printf(" %d: %ld (%ld swapped) long\n",(ulong)uVar8,local_48,
           (ulong)(uVar1 >> 0x18) |
           (ulong)((uVar1 & 0xff0000) >> 8) |
           (ulong)((uVar1 & 0xff00) << 8) | (long)(int)(uVar1 << 0x18));
    uVar8 = uVar8 + 1;
  } while (uVar8 != 7);
  puts(" -- meshb/solb");
  rewind(__stream);
  printf("%d sizeof(REF_FILEPOS)\n");
  iVar9 = fseeko(__stream,0,2);
  if (iVar9 == 0) {
    _Var4 = ftello(__stream);
    rewind(__stream);
    sVar3 = fread(&local_4c,4,1,__stream);
    uVar8 = local_4c;
    if (sVar3 == 1) {
      printf("%d meshb code\n",(ulong)local_4c);
      if (uVar8 == 1) {
        sVar3 = fread(&local_4c,4,1,__stream);
        uVar8 = local_4c;
        if (sVar3 != 1) {
          pcVar10 = "version";
          uVar11 = 1;
          uVar7 = 0x71a;
          goto LAB_00200813;
        }
        printf("%d version\n",(ulong)local_4c);
        if ((0xfffffffb < uVar8 - 5) &&
           (local_40 = ftello(__stream), 0 < local_40 && local_40 <= _Var4)) {
          do {
            iVar9 = fseeko(__stream,local_40,0);
            if (iVar9 != 0) {
              pcVar10 = "fseeko NEXT failed";
              uVar7 = 0x720;
              goto LAB_0020037e;
            }
            sVar3 = fread(&local_34,4,1,__stream);
            uVar1 = local_34;
            if (sVar3 != 1) {
              pcVar10 = "keyword code";
              uVar11 = 1;
              uVar7 = 0x723;
              goto LAB_00200813;
            }
            printf("%d keyword",(ulong)local_34);
            if (0x35 < (int)uVar1) {
              if ((int)uVar1 < 0x56) {
                if (uVar1 == 0x36) {
                  pcVar10 = " END";
                }
                else {
                  if (uVar1 != 0x3e) goto switchD_0020056f_caseD_b;
                  pcVar10 = " solution at vertices";
                }
              }
              else {
                switch(uVar1) {
                case 0x56:
                  pcVar10 = " prism P2";
                  break;
                case 0x57:
                  pcVar10 = " pyramid P2";
                  break;
                case 0x58:
                case 0x59:
                case 0x5b:
                  goto switchD_0020056f_caseD_b;
                case 0x5a:
                  pcVar10 = " triangle P3";
                  break;
                case 0x5c:
                  pcVar10 = " edge P3";
                  break;
                default:
                  if (uVar1 != 0x7e) goto switchD_0020056f_caseD_b;
                  pcVar10 = " CAD data";
                }
              }
              goto LAB_002006a9;
            }
            switch(uVar1) {
            case 3:
              pcVar10 = " dimension";
              break;
            case 4:
              pcVar10 = " vertex";
              break;
            case 5:
              pcVar10 = " edge P1";
              break;
            case 6:
              pcVar10 = " triangle P1";
              break;
            case 7:
              pcVar10 = " quad P1";
              break;
            case 8:
              pcVar10 = " tetrahedra P1";
              break;
            case 9:
              pcVar10 = " prism P1";
              break;
            case 10:
              pcVar10 = " hex P1";
              break;
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x14:
            case 0x15:
            case 0x16:
            case 0x17:
            case 0x1a:
            case 0x1c:
            case 0x1d:
            case 0x1f:
            case 0x20:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
switchD_0020056f_caseD_b:
              putchar(10);
              goto LAB_002006ae;
            case 0x18:
              pcVar10 = " triangle P2";
              break;
            case 0x19:
              pcVar10 = " edge P2";
              break;
            case 0x1b:
              pcVar10 = " quad P2";
              break;
            case 0x1e:
              pcVar10 = " tetrahedra P2";
              break;
            case 0x21:
              pcVar10 = " hex P2";
              break;
            case 0x28:
              pcVar10 = " geom node assoc";
              break;
            case 0x29:
              pcVar10 = " geom edge assoc";
              break;
            case 0x2a:
              pcVar10 = " geom face assoc";
              break;
            default:
              if (uVar1 != 0x31) goto switchD_0020056f_caseD_b;
              pcVar10 = " pyramid P1";
            }
LAB_002006a9:
            puts(pcVar10);
LAB_002006ae:
            RVar2 = meshb_pos((FILE *)__stream,uVar8,&local_40);
            _Var6 = local_40;
            if (RVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x771,"ref_import_examine_header",1,"meshb pos");
              return 1;
            }
            if (local_40 < 1) {
              putchar(10);
            }
            else {
              _Var5 = ftello(__stream);
              printf(" %ld size\n",_Var6 - _Var5);
            }
            _Var6 = ftello(__stream);
            if (uVar1 == 3 || (int)uVar8 < 4) {
              if (_Var6 < _Var4) {
                sVar3 = fread(&local_4c,4,1,__stream);
                if (sVar3 != 1) {
                  pcVar10 = "code";
                  uVar11 = 1;
                  uVar7 = 0x77f;
                  goto LAB_00200813;
                }
                printf("  %d first i4\n",(ulong)local_4c);
              }
            }
            else if (_Var6 < _Var4) {
              sVar3 = fread(&local_48,8,1,__stream);
              if (sVar3 != 1) {
                pcVar10 = "code";
                uVar11 = 1;
                uVar7 = 0x77a;
                goto LAB_00200813;
              }
              printf("  %ld first i8\n",local_48);
            }
            _Var6 = ftello(__stream);
            if (_Var6 < _Var4) {
              sVar3 = fread(&local_4c,4,1,__stream);
              if (sVar3 != 1) {
                pcVar10 = "code";
                uVar11 = 1;
                uVar7 = 0x784;
                goto LAB_00200813;
              }
              printf("  %d second i4\n",(ulong)local_4c);
            }
          } while ((local_40 <= _Var4) && (0 < local_40));
        }
      }
      fclose(__stream);
      return 0;
    }
    pcVar10 = "code";
    uVar11 = 1;
    uVar7 = 0x717;
  }
  else {
    pcVar10 = "fseeko END failed";
    uVar7 = 0x712;
LAB_0020037e:
    sVar3 = (size_t)iVar9;
    uVar11 = 0;
  }
LAB_00200813:
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar7,
         "ref_import_examine_header",pcVar10,uVar11,sVar3);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_import_examine_header(const char *filename) {
  FILE *file;
  REF_FILEPOS next_position, end_position;
  int i4, i4_swapped, version, keyword_code;
  long i8, i8_swapped;
  int i;
  REF_BOOL file_position_report = REF_FALSE;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  printf(" -- 32bit ugrid header\n");

  rewind(file);

  for (i = 0; i < 8; i++) {
    RES(1, fread(&i4, sizeof(int), 1, file), "int");
    i4_swapped = i4;
    SWAP_INT(i4_swapped);
    printf(" %d: %d (%d swapped) ints\n", i, i4, i4_swapped);
  }

  printf(" -- 64bit ugrid header\n");

  rewind(file);

  for (i = 0; i < 3; i++) {
    RES(1, fread(&i4, sizeof(int), 1, file), "int");
  }
  for (i = 3; i < 7; i++) {
    RES(1, fread(&i8, sizeof(long), 1, file), "long");
    i8_swapped = i8;
    SWAP_INT(i8_swapped);
    printf(" %d: %ld (%ld swapped) long\n", i, i8, i8_swapped);
  }

  printf(" -- meshb/solb\n");

  rewind(file);

  printf("%d sizeof(REF_FILEPOS)\n", (REF_INT)sizeof(REF_FILEPOS));

  REIS(0, fseeko(file, 0, SEEK_END), "fseeko END failed");
  end_position = ftello(file);
  if (file_position_report) printf("%ld end_position\n", (long)end_position);
  rewind(file);

  REIS(1, fread((unsigned char *)&i4, 4, 1, file), "code");
  printf("%d meshb code\n", i4);
  if (1 != i4) goto close_file_and_return;
  REIS(1, fread((unsigned char *)&i4, 4, 1, file), "version");
  printf("%d version\n", i4);
  if (1 > i4 || i4 > 4) goto close_file_and_return;
  version = i4;
  next_position = ftello(file);
  while (next_position <= end_position && 0 < next_position) {
    REIS(0, fseeko(file, next_position, SEEK_SET), "fseeko NEXT failed");
    if (file_position_report)
      printf("%ld current position\n", (long)next_position);
    REIS(1, fread((unsigned char *)&keyword_code, 4, 1, file), "keyword code");
    printf("%d keyword", keyword_code);
    switch (keyword_code) {
      case 3:
        printf(" dimension\n");
        break;
      case 4:
        printf(" vertex\n");
        break;
      case 5:
        printf(" edge P1\n");
        break;
      case 25:
        printf(" edge P2\n");
        break;
      case 92:
        printf(" edge P3\n");
        break;
      case 6:
        printf(" triangle P1\n");
        break;
      case 24:
        printf(" triangle P2\n");
        break;
      case 90:
        printf(" triangle P3\n");
        break;
      case 7:
        printf(" quad P1\n");
        break;
      case 27:
        printf(" quad P2\n");
        break;
      case 8:
        printf(" tetrahedra P1\n");
        break;
      case 49:
        printf(" pyramid P1\n");
        break;
      case 9:
        printf(" prism P1\n");
        break;
      case 10:
        printf(" hex P1\n");
        break;
      case 30:
        printf(" tetrahedra P2\n");
        break;
      case 87:
        printf(" pyramid P2\n");
        break;
      case 86:
        printf(" prism P2\n");
        break;
      case 33:
        printf(" hex P2\n");
        break;
      case 40:
        printf(" geom node assoc\n");
        break;
      case 41:
        printf(" geom edge assoc\n");
        break;
      case 42:
        printf(" geom face assoc\n");
        break;
      case 62:
        printf(" solution at vertices\n");
        break;
      case 126:
        printf(" CAD data\n");
        break;
      case 54:
        printf(" END\n");
        break;
      default:
        printf("\n");
    }
    RSS(meshb_pos(file, version, &next_position), "meshb pos");
    if (file_position_report) printf("%ld next position", (long)next_position);
    if (next_position > 0) {
      printf(" %ld size\n", (long)(next_position - ftello(file)));
    } else {
      printf("\n");
    }
    if (version >= 4 && keyword_code != 3) {
      if (ftello(file) < end_position) {
        REIS(1, fread((unsigned char *)&i8, 8, 1, file), "code");
        printf("  %ld first i8\n", i8);
      }
    } else {
      if (ftello(file) < end_position) {
        REIS(1, fread((unsigned char *)&i4, 4, 1, file), "code");
        printf("  %d first i4\n", i4);
      }
    }
    if (ftello(file) < end_position) {
      REIS(1, fread((unsigned char *)&i4, 4, 1, file), "code");
      printf("  %d second i4\n", i4);
    }
  }

close_file_and_return:
  fclose(file);
  return REF_SUCCESS;
}